

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O3

void dirDEFARRAY(void)

{
  char cVar1;
  CStringsList *pCVar2;
  CStringsList *pCVar3;
  bool bVar4;
  int iVar5;
  char *name;
  char *message;
  CStringsList *a;
  CStringsList *local_28;
  
  cVar1 = *lp;
  if (cVar1 == '+') {
    lp = lp + 1;
  }
  bVar4 = White();
  if ((bVar4) && (name = GetID(&lp), name != (char *)0x0)) {
    bVar4 = White();
    if ((bVar4) && (iVar5 = SkipBlanks(), iVar5 == 0)) {
      if (cVar1 != '+') {
        local_28 = (CStringsList *)0x0;
        bVar4 = dirDEFARRAY_parseItems(&local_28);
        pCVar3 = local_28;
        if (bVar4 && local_28 != (CStringsList *)0x0) {
          CDefineTable::Add(&DefineTable,name,"",local_28);
          return;
        }
        if (local_28 != (CStringsList *)0x0) {
          CStringsList::~CStringsList(local_28);
          operator_delete(pCVar3,0x28);
          return;
        }
        return;
      }
      CDefineTable::Get(&DefineTable,name);
      if (DefineTable.DefArrayList != (CStringsList *)0x0) {
        pCVar3 = (DefineTable.DefArrayList)->next;
        while (pCVar2 = pCVar3, pCVar2 != (CStringsList *)0x0) {
          DefineTable.DefArrayList = pCVar2;
          pCVar3 = pCVar2->next;
        }
        dirDEFARRAY_parseItems(&(DefineTable.DefArrayList)->next);
        return;
      }
      message = "[DEFARRAY+] unknown array <id>";
    }
    else {
      iVar5 = SkipBlanks();
      if (iVar5 == 0) {
        message = "[DEFARRAY] missing space between <id> and first <item>";
        name = lp;
      }
      else {
        message = "[DEFARRAY] must have at least one entry";
        name = (char *)0x0;
      }
    }
    Error(message,name,PASS3);
  }
  else {
    Error("[DEFARRAY] Syntax error in <id>",lp,PASS3);
  }
  SkipToEol(&lp);
  return;
}

Assistant:

static void dirDEFARRAY() {
	bool plus = ('+' == *lp) ? ++lp, true : false;
	const char* id = White() ? GetID(lp) : nullptr;
	if (!id) {
		Error("[DEFARRAY] Syntax error in <id>", lp);
		SkipToEol(lp);
		return;
	}
	if (!White() || SkipBlanks()) {	// enforce whitespace between ID and first item and detect empty ones
		if (SkipBlanks()) Error("[DEFARRAY] must have at least one entry");
		else Error("[DEFARRAY] missing space between <id> and first <item>", lp);
		SkipToEol(lp);
		return;
	}
	if (plus) {
		dirDEFARRAY_add(id);
	} else {
		CStringsList* a = NULL;
		if (!dirDEFARRAY_parseItems(&a) || NULL == a) {
			if (a) delete a;	// release already parsed items, if there was syntax error
			return;
		}
		DefineTable.Add(id, "", a);
	}
}